

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall
spatial_region::add_beam
          (spatial_region *this,double cmr,double n0,double u0,double xb,double rb,double x0b,
          double y0b,double phib)

{
  double dVar1;
  celle ***pppcVar2;
  cellb ***pppcVar3;
  spatial_region *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  int_vector3d *a_00;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double in_XMM1_Qa;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double in_XMM2_Qa;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double in_XMM3_Qa;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double in_XMM4_Qa;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong in_XMM5_Qa;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ulong in_XMM6_Qa;
  double in_XMM7_Qa;
  int k;
  int j;
  int i;
  double phi;
  double type;
  double signum;
  double f_ampl;
  double n;
  double r;
  double z;
  double y;
  double x;
  int_vector3d b;
  int_vector3d a;
  double in_stack_fffffffffffffe48;
  int iVar82;
  field3d<cellb> *in_stack_fffffffffffffe50;
  double in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  int_vector3d *in_stack_ffffffffffffff28;
  int local_b4;
  int local_b0;
  int local_ac;
  int_vector3d local_60;
  int_vector3d local_54;
  double local_48;
  ulong local_40;
  ulong local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  undefined1 auVar28 [64];
  
  local_48 = in_XMM7_Qa;
  local_40 = in_XMM6_Qa;
  local_38 = in_XMM5_Qa;
  local_30 = in_XMM4_Qa;
  local_28 = in_XMM3_Qa;
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  int_vector3d::int_vector3d(&local_54);
  int_vector3d::int_vector3d(&local_60);
  local_60.i = in_RDI->xnpic;
  local_60.j = in_RDI->ynpic;
  local_60.k = in_RDI->znpic;
  dVar4 = (double)(int)((uint)(0.0 < local_20) - (uint)(local_20 < 0.0));
  dVar5 = (double)(int)((uint)(0.0 < local_10) - (uint)(local_10 < 0.0));
  auVar28 = ZEXT864((ulong)dVar5);
  for (local_ac = 0; local_ac < in_RDI->nx; local_ac = local_ac + 1) {
    for (local_b0 = 0; local_b0 < in_RDI->ny; local_b0 = local_b0 + 1) {
      for (local_b4 = 0; local_b4 < in_RDI->nz; local_b4 = local_b4 + 1) {
        local_54.i = local_ac;
        local_54.j = local_b0;
        local_54.k = local_b4;
        auVar29._0_8_ = (double)(local_b0 - in_RDI->ny / 2);
        auVar29._8_8_ = auVar28._8_8_;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = in_RDI->dy;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = local_40 ^ 0x8000000000000000;
        auVar10 = vfmadd213sd_fma(auVar10,auVar29,auVar46);
        auVar47._0_8_ = (double)local_ac;
        auVar47._8_8_ = auVar28._8_8_;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = in_RDI->dx;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_38 ^ 0x8000000000000000;
        auVar11 = vfmadd213sd_fma(auVar30,auVar47,auVar69);
        dVar6 = atan2(auVar10._0_8_,auVar11._0_8_);
        auVar11._0_8_ = (double)local_ac;
        auVar11._8_8_ = extraout_XMM0_Qb;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = in_RDI->dx;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_38 ^ 0x8000000000000000;
        auVar10 = vfmadd213sd_fma(auVar31,auVar11,auVar48);
        auVar49._0_8_ = (double)local_ac;
        auVar49._8_8_ = extraout_XMM0_Qb;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = in_RDI->dx;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = local_38 ^ 0x8000000000000000;
        auVar11 = vfmadd213sd_fma(auVar12,auVar49,auVar70);
        auVar71._0_8_ = (double)(local_b0 - in_RDI->ny / 2);
        auVar71._8_8_ = extraout_XMM0_Qb;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = in_RDI->dy;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = local_40 ^ 0x8000000000000000;
        auVar12 = vfmadd213sd_fma(auVar50,auVar71,auVar76);
        auVar77._0_8_ = (double)(local_b0 - in_RDI->ny / 2);
        auVar77._8_8_ = extraout_XMM0_Qb;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = in_RDI->dy;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = local_40 ^ 0x8000000000000000;
        auVar13 = vfmadd213sd_fma(auVar72,auVar77,auVar80);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = auVar12._0_8_ * auVar13._0_8_;
        auVar10 = vfmadd213sd_fma(auVar11,auVar10,auVar51);
        a_00 = (int_vector3d *)sqrt(auVar10._0_8_);
        dVar7 = cos(dVar6 - local_48);
        dVar7 = (double)a_00 * dVar7;
        auVar13._0_8_ = (double)local_ac;
        auVar13._8_8_ = 0;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = in_RDI->dx;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = local_38 ^ 0x8000000000000000;
        auVar10 = vfmadd213sd_fma(auVar32,auVar13,auVar52);
        auVar53._0_8_ = (double)local_ac;
        auVar53._8_8_ = 0;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = in_RDI->dx;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = local_38 ^ 0x8000000000000000;
        auVar11 = vfmadd213sd_fma(auVar14,auVar53,auVar73);
        auVar74._0_8_ = (double)(local_b0 - in_RDI->ny / 2);
        auVar74._8_8_ = 0;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = in_RDI->dy;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = local_40 ^ 0x8000000000000000;
        auVar12 = vfmadd213sd_fma(auVar54,auVar74,auVar78);
        auVar79._0_8_ = (double)(local_b0 - in_RDI->ny / 2);
        auVar79._8_8_ = 0;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = in_RDI->dy;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = local_40 ^ 0x8000000000000000;
        auVar13 = vfmadd213sd_fma(auVar75,auVar79,auVar81);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = auVar12._0_8_ * auVar13._0_8_;
        auVar10 = vfmadd213sd_fma(auVar11,auVar10,auVar55);
        dVar8 = sqrt(auVar10._0_8_);
        dVar6 = sin(dVar6 - local_48);
        dVar6 = dVar8 * dVar6;
        dVar1 = (double)(local_b4 - in_RDI->nz / 2) * in_RDI->dz;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar6;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar6;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = dVar1 * dVar1;
        auVar10 = vfmadd213sd_fma(auVar15,auVar33,auVar56);
        dVar9 = sqrt(auVar10._0_8_);
        if (((-local_28 < dVar7) && (dVar7 < local_28)) && (dVar9 < local_30)) {
          cos(local_48);
          sin(local_48);
          fill_cell_by_particles
                    (in_RDI,dVar8,a_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff00);
          dVar8 = local_18 * 0.5 * (1.0 - (dVar7 * dVar7) / (local_28 * local_28)) *
                  (1.0 - (dVar9 * dVar9) / (local_30 * 2.0 * local_30));
          auVar16._0_8_ = sin(local_48);
          iVar82 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
          pppcVar2 = field3d<celle>::operator[]((field3d<celle> *)in_stack_fffffffffffffe50,iVar82);
          auVar16._8_8_ = 0;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = (*pppcVar2)[local_b0][local_b4].ex;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = -(dVar5 * dVar8 * dVar6);
          auVar10 = vfmadd213sd_fma(auVar16,auVar34,auVar57);
          (*pppcVar2)[local_b0][local_b4].ex = auVar10._0_8_;
          auVar17._0_8_ = cos(local_48);
          pppcVar2 = field3d<celle>::operator[]((field3d<celle> *)in_stack_fffffffffffffe50,iVar82);
          auVar17._8_8_ = 0;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar5 * dVar8 * dVar6;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = (*pppcVar2)[local_b0][local_b4].ey;
          auVar10 = vfmadd213sd_fma(auVar17,auVar35,auVar58);
          (*pppcVar2)[local_b0][local_b4].ey = auVar10._0_8_;
          pppcVar2 = field3d<celle>::operator[]((field3d<celle> *)in_stack_fffffffffffffe50,iVar82);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar1;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar5 * dVar8;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = (*pppcVar2)[local_b0][local_b4].ez;
          auVar10 = vfmadd213sd_fma(auVar18,auVar36,auVar59);
          (*pppcVar2)[local_b0][local_b4].ez = auVar10._0_8_;
          in_stack_ffffffffffffff08 = dVar5 * dVar4 * dVar8 * dVar1;
          in_stack_ffffffffffffff00 = sin(local_48);
          pppcVar3 = field3d<cellb>::operator[](in_stack_fffffffffffffe50,iVar82);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = in_stack_ffffffffffffff00;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = in_stack_ffffffffffffff08;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = (*pppcVar3)[local_b0][local_b4].bx;
          auVar10 = vfmadd213sd_fma(auVar19,auVar37,auVar60);
          (*pppcVar3)[local_b0][local_b4].bx = auVar10._0_8_;
          in_stack_ffffffffffffff10 = dVar5 * dVar4 * dVar8 * dVar1;
          in_stack_ffffffffffffff18 = cos(local_48);
          pppcVar3 = field3d<cellb>::operator[](in_stack_fffffffffffffe50,iVar82);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = in_stack_ffffffffffffff18;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = (*pppcVar3)[local_b0][local_b4].by;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = -in_stack_ffffffffffffff10;
          auVar10 = vfmadd213sd_fma(auVar20,auVar38,auVar61);
          (*pppcVar3)[local_b0][local_b4].by = auVar10._0_8_;
          in_stack_ffffffffffffff28 = (int_vector3d *)(dVar5 * dVar4 * dVar8);
          in_stack_ffffffffffffff20 = dVar6;
          pppcVar3 = field3d<cellb>::operator[](in_stack_fffffffffffffe50,iVar82);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = in_stack_ffffffffffffff20;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = in_stack_ffffffffffffff28;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = (*pppcVar3)[local_b0][local_b4].bz;
          auVar10 = vfmadd213sd_fma(auVar21,auVar39,auVar62);
          (*pppcVar3)[local_b0][local_b4].bz = auVar10._0_8_;
        }
        auVar28 = ZEXT864((ulong)dVar7);
        if (-local_28 < dVar7) {
          auVar28 = ZEXT864((ulong)local_28);
          if ((dVar7 < local_28) && (auVar28 = ZEXT864((ulong)dVar9), local_30 <= dVar9)) {
            dVar7 = (local_18 * 0.25 * (1.0 - (dVar7 * dVar7) / (local_28 * local_28)) * local_30 *
                    local_30) / (dVar9 * dVar9);
            in_stack_fffffffffffffe48 = dVar5 * dVar7 * dVar6;
            in_stack_fffffffffffffe50 = (field3d<cellb> *)sin(local_48);
            iVar82 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffe50,iVar82);
            auVar22._8_8_ = 0;
            auVar22._0_8_ = in_stack_fffffffffffffe50;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = (*pppcVar2)[local_b0][local_b4].ex;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = -in_stack_fffffffffffffe48;
            auVar10 = vfmadd213sd_fma(auVar22,auVar40,auVar63);
            (*pppcVar2)[local_b0][local_b4].ex = auVar10._0_8_;
            auVar23._0_8_ = cos(local_48);
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffe50,iVar82);
            auVar23._8_8_ = 0;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = dVar5 * dVar7 * dVar6;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = (*pppcVar2)[local_b0][local_b4].ey;
            auVar10 = vfmadd213sd_fma(auVar23,auVar41,auVar64);
            (*pppcVar2)[local_b0][local_b4].ey = auVar10._0_8_;
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffe50,iVar82);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar1;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = dVar5 * dVar7;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = (*pppcVar2)[local_b0][local_b4].ez;
            auVar10 = vfmadd213sd_fma(auVar24,auVar42,auVar65);
            (*pppcVar2)[local_b0][local_b4].ez = auVar10._0_8_;
            auVar25._0_8_ = sin(local_48);
            pppcVar3 = field3d<cellb>::operator[](in_stack_fffffffffffffe50,iVar82);
            auVar25._8_8_ = 0;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = dVar5 * dVar4 * dVar7 * dVar1;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = (*pppcVar3)[local_b0][local_b4].bx;
            auVar10 = vfmadd213sd_fma(auVar25,auVar43,auVar66);
            (*pppcVar3)[local_b0][local_b4].bx = auVar10._0_8_;
            auVar26._0_8_ = cos(local_48);
            pppcVar3 = field3d<cellb>::operator[](in_stack_fffffffffffffe50,iVar82);
            auVar26._8_8_ = 0;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = (*pppcVar3)[local_b0][local_b4].by;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = -(dVar5 * dVar4 * dVar7 * dVar1);
            auVar10 = vfmadd213sd_fma(auVar26,auVar44,auVar67);
            (*pppcVar3)[local_b0][local_b4].by = auVar10._0_8_;
            pppcVar3 = field3d<cellb>::operator[](in_stack_fffffffffffffe50,iVar82);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = dVar6;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = dVar5 * dVar4 * dVar7;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = (*pppcVar3)[local_b0][local_b4].bz;
            auVar10 = vfmadd213sd_fma(auVar27,auVar45,auVar68);
            auVar28 = ZEXT1664(auVar10);
            (*pppcVar3)[local_b0][local_b4].bz = auVar10._0_8_;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::add_beam(double cmr, double n0, double u0, double xb, double rb, double x0b, double y0b, double phib)
{
    /* Добавляет электронный пучок с полями, вычисленными в
     * приближении бесконечного гамма-фактора пучка. n0 - максимальная
     * концентрация электронов в пучке, нормированная на критическую
     * концентрацию. phib - направление (в плоскости xy), в котором пучок распространяется
     */

    int_vector3d a,b;
    b.i = xnpic;
    b.j = ynpic;
    b.k = znpic;
    double x, y, z, r, n, f_ampl, signum, type, phi;
    signum = (u0>0) - (u0<0);
    type = (cmr>0)-(cmr<0);
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            for(int k=0; k<nz; k++)
            {
                a.i = i;
                a.j = j;
                a.k = k;
                phi = atan2((j-ny/2)*dy-y0b, i*dx-x0b);
                // x,y,z are in the rotated (by phib) coordinate system
                x = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * cos(phi - phib);
                y = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * sin(phi - phib);
                z = (k-nz/2)*dz;
                r = sqrt(y*y + z*z);
                if (x>-xb && x<xb && r<rb)
                {
                    n = n0*(1-x*x/(xb*xb))*(1-r*r/(rb*rb));
                    fill_cell_by_particles(cmr,a,b,n,u0*cos(phib),u0*sin(phib));
                    f_ampl = 0.5*n0*(1-x*x/(xb*xb))*(1-r*r/(2*rb*rb));
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
                if (x>-xb && x<xb && r>=rb)
                {
                    f_ampl = 0.25*n0*(1-x*x/(xb*xb))*rb*rb/(r*r);
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
            }
        }
    }
}